

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::Decode
          (Directed_Energy_Fire_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  *this_00;
  KUINT16 KVar1;
  StandardVariable *pSVar2;
  KException *this_01;
  int iVar3;
  undefined7 in_register_00000011;
  ushort uVar4;
  KUINT32 datumID;
  KString local_50;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (0x57 < iVar3 + (uint)KVar1) {
    this_00 = &this->m_vDeRec;
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
    ::clear(this_00);
    Header7::Decode(&this->super_Header,stream,ignoreHeader);
    (*(this->m_FiringEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_FiringEntityID,stream);
    (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EventID,stream);
    (*(this->m_MunTyp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_MunTyp,stream);
    (*(this->m_ShotStartTime).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_ShotStartTime,stream);
    KDataStream::Read<float>(stream,(float *)&this->m_f32CumulativeShotTime);
    (*(this->m_EmitterLoc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EmitterLoc,stream);
    KDataStream::Read<float>(stream,(float *)&this->m_f32AperDiameter);
    KDataStream::Read<float>(stream,(float *)&this->m_f32Wavelength);
    KDataStream::Read<float>(stream,(float *)&this->m_f32PeakIrradiance);
    KDataStream::Read<float>(stream,(float *)&this->m_f32PulseRepFreq);
    KDataStream::Read<float>(stream,(float *)&this->m_f32PulseWidth);
    KDataStream::Read<unsigned_short>(stream,&(this->m_DeUnion).m_ui16Flags);
    KDataStream::Read(stream,&this->m_ui8PulseShp);
    KDataStream::Read(stream,&this->m_ui8Padding1);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding2);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding3);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumDERecs);
    for (uVar4 = 0; uVar4 < this->m_ui16NumDERecs; uVar4 = uVar4 + 1) {
      KVar1 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read<unsigned_int>(stream,&datumID);
      KDataStream::SetCurrentWritePosition(stream,KVar1);
      pSVar2 = DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::StandardVariable>::FactoryDecode
                         (datumID,stream);
      if (pSVar2 == (StandardVariable *)0x0) {
        pSVar2 = (StandardVariable *)operator_new(0x10);
        DATA_TYPE::StandardVariable::StandardVariable(pSVar2,stream);
        local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00214868;
        local_50._M_string_length = (size_type)pSVar2;
        local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
                    *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_50);
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00214868;
        local_50._M_string_length = (size_type)pSVar2;
        local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
                    *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_50);
      }
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::~KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_50);
    }
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Decode",(allocator<char> *)&datumID);
  KException::KException(this_01,&local_50,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void Directed_Energy_Fire_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < DIRECTED_ENERGY_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vDeRec.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_FiringEntityID
           >> KDIS_STREAM m_EventID
           >> KDIS_STREAM m_MunTyp
           >> KDIS_STREAM m_ShotStartTime
           >> m_f32CumulativeShotTime
           >> KDIS_STREAM m_EmitterLoc
           >> m_f32AperDiameter
           >> m_f32Wavelength
           >> m_f32PeakIrradiance
           >> m_f32PulseRepFreq
           >> m_f32PulseWidth
           >> m_DeUnion.m_ui16Flags
           >> m_ui8PulseShp
           >> m_ui8Padding1
           >> m_ui32Padding2
           >> m_ui16Padding3
           >> m_ui16NumDERecs;

    for( KUINT16 i = 0; i < m_ui16NumDERecs; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        StandardVariable * p = StandardVariable::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vDeRec.push_back( StdVarPtr( p ) );
        }
        else
        {
            // Default
            m_vDeRec.push_back( StdVarPtr( new StandardVariable( stream ) ) );
        }
    }
}